

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void __thiscall
rtosc::MergePorts::MergePorts(MergePorts *this,initializer_list<const_rtosc::Ports_*> c)

{
  iterator ppPVar1;
  value_type *pvVar2;
  pointer pPVar3;
  int iVar4;
  vector<rtosc::Port,_std::allocator<rtosc::Port>_> *__range3;
  Port *pp;
  pointer pPVar5;
  iterator ppPVar6;
  bool bVar7;
  Port *p;
  value_type *__x;
  
  ppPVar6 = c._M_array;
  Ports::Ports(&this->super_Ports,(initializer_list<rtosc::Port>)ZEXT816(0));
  ppPVar1 = ppPVar6 + c._M_len;
  for (; ppPVar6 != ppPVar1; ppPVar6 = ppPVar6 + 1) {
    pvVar2 = ((*ppPVar6)->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (__x = ((*ppPVar6)->ports).super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>.
               _M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
      pPVar3 = (this->super_Ports).ports.
               super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar7 = false;
      for (pPVar5 = (this->super_Ports).ports.
                    super__Vector_base<rtosc::Port,_std::allocator<rtosc::Port>_>._M_impl.
                    super__Vector_impl_data._M_start; pPVar5 != pPVar3; pPVar5 = pPVar5 + 1) {
        iVar4 = strcmp(pPVar5->name,__x->name);
        bVar7 = (bool)(bVar7 | iVar4 == 0);
      }
      if (!bVar7) {
        std::vector<rtosc::Port,_std::allocator<rtosc::Port>_>::push_back
                  ((vector<rtosc::Port,_std::allocator<rtosc::Port>_> *)this,__x);
      }
    }
  }
  Ports::refreshMagic(&this->super_Ports);
  return;
}

Assistant:

MergePorts::MergePorts(std::initializer_list<const rtosc::Ports*> c)
    :Ports({})
{
    //XXX TODO remove duplicates in some sane and documented way
    //e.g. repeated ports override and remove older ones
    for(auto *to_clone:c) {
        assert(to_clone);
        for(auto &p:to_clone->ports) {
            bool already_there = false;
            for(auto &pp:ports)
                if(!strcmp(pp.name, p.name))
                    already_there = true;

            if(!already_there)
                ports.push_back(p);
        }
    }

    refreshMagic();
}